

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O3

lrtr_ipv6_addr lrtr_ipv6_get_bits(lrtr_ipv6_addr *val,uint8_t first_bit,uint8_t quantity)

{
  long lVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  byte bVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  lrtr_ipv6_addr lVar8;
  ulong local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)first_bit < '\0') {
    __assert_fail("first_bit <= 127",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                  ,0x20,
                  "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                 );
  }
  if (0x80 < quantity) {
    __assert_fail("quantity <= 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                  ,0x21,
                  "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                 );
  }
  uVar6 = (int)CONCAT71(in_register_00000031,first_bit) + (uint)quantity;
  if (0x80 < uVar6) {
    __assert_fail("first_bit + quantity <= 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/ipv6.c"
                  ,0x22,
                  "struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *, const uint8_t, const uint8_t)"
                 );
  }
  if (first_bit < 0x20) {
    uVar2 = ' ';
    if (quantity < 0x20) {
      uVar2 = quantity;
    }
    quantity = quantity - uVar2;
    uVar3 = lrtr_get_bits(val->addr[0],first_bit,uVar2);
    local_40 = (ulong)uVar3;
  }
  else {
    local_40 = 0;
  }
  uVar7 = 0;
  if (0x20 < uVar6 && first_bit < 0x40) {
    bVar4 = 0x20;
    if (quantity < 0x20) {
      bVar4 = quantity;
    }
    uVar2 = first_bit + 0xe0;
    if (first_bit < 0x20) {
      uVar2 = '\0';
    }
    quantity = quantity - bVar4;
    uVar3 = lrtr_get_bits(val->addr[1],uVar2,bVar4);
    uVar7 = (ulong)uVar3 << 0x20;
  }
  uVar5 = 0;
  if (0x40 < uVar6 && first_bit < 0x60) {
    bVar4 = 0x20;
    if (quantity < 0x20) {
      bVar4 = quantity;
    }
    uVar2 = first_bit + 0xc0;
    if (first_bit < 0x40) {
      uVar2 = '\0';
    }
    quantity = quantity - bVar4;
    uVar3 = lrtr_get_bits(val->addr[2],uVar2,bVar4);
    uVar5 = (ulong)uVar3;
  }
  if (0x60 < uVar6) {
    bVar4 = 0x20;
    if (quantity < 0x20) {
      bVar4 = quantity;
    }
    uVar2 = first_bit + 0xa0;
    if (first_bit < 0x60) {
      uVar2 = '\0';
    }
    uVar3 = lrtr_get_bits(val->addr[3],uVar2,bVar4);
    uVar5 = uVar5 | (ulong)uVar3 << 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    lVar8.addr[2] = (int)uVar5;
    lVar8.addr[3] = (int)(uVar5 >> 0x20);
    lVar8.addr[0] = (int)(uVar7 | local_40);
    lVar8.addr[1] = (int)((uVar7 | local_40) >> 0x20);
    return (lrtr_ipv6_addr)lVar8.addr;
  }
  __stack_chk_fail();
}

Assistant:

struct lrtr_ipv6_addr lrtr_ipv6_get_bits(const struct lrtr_ipv6_addr *val, const uint8_t first_bit,
					 const uint8_t quantity)
{
	assert(first_bit <= 127);
	assert(quantity <= 128);
	assert(first_bit + quantity <= 128);

	// if no bytes get extracted the result has to be 0
	struct lrtr_ipv6_addr result;

	memset(&result, 0, sizeof(result));

	uint8_t bits_left = quantity;

	if (first_bit <= 31) {
		const uint8_t q = quantity > 32 ? 32 : quantity;

		assert(bits_left >= q);
		bits_left -= q;
		result.addr[0] = lrtr_get_bits(val->addr[0], first_bit, q);
	}

	if ((first_bit <= 63) && ((first_bit + quantity) > 32)) {
		const uint8_t fr = first_bit < 32 ? 0 : first_bit - 32;
		const uint8_t q = bits_left > 32 ? 32 : bits_left;

		assert(bits_left >= q);
		bits_left -= q;
		result.addr[1] = lrtr_get_bits(val->addr[1], fr, q);
	}

	if ((first_bit <= 95) && ((first_bit + quantity) > 64)) {
		const uint8_t fr = first_bit < 64 ? 0 : first_bit - 64;
		const uint8_t q = bits_left > 32 ? 32 : bits_left;

		assert(bits_left >= q);
		bits_left -= q;
		result.addr[2] = lrtr_get_bits(val->addr[2], fr, q);
	}

	if ((first_bit <= 127) && ((first_bit + quantity) > 96)) {
		const uint8_t fr = first_bit < 96 ? 0 : first_bit - 96;
		const uint8_t q = bits_left > 32 ? 32 : bits_left;

		assert(bits_left >= q);
		result.addr[3] = lrtr_get_bits(val->addr[3], fr, q);
	}
	return result;
}